

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O0

bool __thiscall rsg::Token::operator!=(Token *this,Token *other)

{
  deBool dVar1;
  Token *other_local;
  Token *this_local;
  
  if (this->m_type == other->m_type) {
    if ((this->m_type == IDENTIFIER) &&
       (dVar1 = deStringEqual((this->m_arg).identifier,(other->m_arg).identifier), dVar1 == 0)) {
      this_local._7_1_ = false;
    }
    else if ((this->m_type == FLOAT_LITERAL) &&
            (((this->m_arg).floatValue != (other->m_arg).floatValue ||
             (NAN((this->m_arg).floatValue) || NAN((other->m_arg).floatValue))))) {
      this_local._7_1_ = false;
    }
    else if ((this->m_type == INT_LITERAL) && ((this->m_arg).intValue != (other->m_arg).intValue)) {
      this_local._7_1_ = false;
    }
    else if ((this->m_type == BOOL_LITERAL) &&
            (((this->m_arg).boolValue & 1U) != ((other->m_arg).boolValue & 1U))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Token::operator!= (const Token& other) const
{
	if (m_type != other.m_type)
		return false;

	if (m_type == IDENTIFIER && !deStringEqual(m_arg.identifier, other.m_arg.identifier))
		return false;
	else if (m_type == FLOAT_LITERAL && m_arg.floatValue != other.m_arg.floatValue)
		return false;
	else if (m_type == INT_LITERAL && m_arg.intValue != other.m_arg.intValue)
		return false;
	else if (m_type == BOOL_LITERAL && m_arg.boolValue != other.m_arg.boolValue)
		return false;

	return true;
}